

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

const_iterator __thiscall
frozen::
unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
::
find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
          (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hash,
          equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal)

{
  value_type *pvVar1;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *unaff_retaddr;
  
  pvVar1 = find_impl<frozen::unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>const&,std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                     ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             hash,
                      (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)equal,
                      unaff_retaddr);
  return pvVar1;
}

Assistant:

constexpr const_iterator find(KeyType const &key, Hasher const &hash, Equal const &equal) const {
    return find_impl(*this, key, hash, equal);
  }